

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
             *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  long lVar1;
  char *__value;
  char __tmp;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
  local_39;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_38;
  
  lVar1 = *(long *)(this + 0x10);
  if (lVar1 != 0) {
    __value = *(char **)(this + 8);
    local_38._M_stream = it->_M_stream;
    local_38._M_string = it->_M_string;
    if (0 < lVar1) {
      lVar1 = lVar1 + 1;
      do {
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_38,__value);
        __value = __value + 1;
        lVar1 = lVar1 + -1;
      } while (1 < lVar1);
    }
    it->_M_stream = local_38._M_stream;
    it->_M_string = local_38._M_string;
  }
  lVar1 = *(long *)(this + 0x20);
  local_38._M_stream = it->_M_stream;
  local_38._M_string = it->_M_string;
  local_39 = this[0x18];
  if (lVar1 != 0) {
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                (&local_38,(char *)&local_39);
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  it->_M_stream = local_38._M_stream;
  it->_M_string = local_38._M_string;
  int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer::operator()
            ((num_writer *)(this + 0x28),it);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }